

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn.c
# Opt level: O3

int cmn_set_repr(cmn_t *cmn,char *repr)

{
  char *pcVar1;
  char *pcVar2;
  char *__s;
  long lVar3;
  double dVar4;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
          ,0x7c,"Update from < %s >\n",cmn->repr);
  memset(cmn->cmn_mean,0,(long)cmn->veclen << 2);
  memset(cmn->sum,0,(long)cmn->veclen << 2);
  pcVar1 = __ckd_salloc__(repr,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
                          ,0x7f);
  if (0 < cmn->veclen) {
    lVar3 = 0;
    __s = pcVar1;
    do {
      pcVar2 = strchr(__s,0x2c);
      if (pcVar2 == (char *)0x0) {
        if (*__s != '\0') {
          dVar4 = atof_c(__s);
          cmn->cmn_mean[lVar3] = (mfcc_t)(float)dVar4;
          cmn->sum[lVar3] = (mfcc_t)((float)dVar4 * 500.0);
        }
        break;
      }
      *pcVar2 = '\0';
      dVar4 = atof_c(__s);
      cmn->cmn_mean[lVar3] = (mfcc_t)(float)dVar4;
      cmn->sum[lVar3] = (mfcc_t)((float)dVar4 * 500.0);
      __s = pcVar2 + 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < cmn->veclen);
  }
  ckd_free(pcVar1);
  cmn->nframe = 500;
  pcVar1 = cmn_update_repr(cmn);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn.c"
          ,0x90,"Update to   < %s >\n",pcVar1);
  return 0;
}

Assistant:

int
cmn_set_repr(cmn_t *cmn, const char *repr)
{
    char *c, *cc, *vallist;
    int32 nvals;

    E_INFO("Update from < %s >\n", cmn->repr);
    memset(cmn->cmn_mean, 0, sizeof(cmn->cmn_mean[0]) * cmn->veclen);
    memset(cmn->sum, 0, sizeof(cmn->sum[0]) * cmn->veclen);
    vallist = ckd_salloc(repr);
    c = vallist;
    nvals = 0;
    while (nvals < cmn->veclen
           && (cc = strchr(c, ',')) != NULL) {
        *cc = '\0';
        cmn->cmn_mean[nvals] = FLOAT2MFCC(atof_c(c));
        cmn->sum[nvals] = cmn->cmn_mean[nvals] * CMN_WIN;
        c = cc + 1;
        ++nvals;
    }
    if (nvals < cmn->veclen && *c != '\0') {
        cmn->cmn_mean[nvals] = FLOAT2MFCC(atof_c(c));
        cmn->sum[nvals] = cmn->cmn_mean[nvals] * CMN_WIN;
    }
    ckd_free(vallist);
    cmn->nframe = CMN_WIN;
    E_INFO("Update to   < %s >\n", cmn_update_repr(cmn));
    return 0;
}